

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmValue __thiscall
cmGeneratorTarget::GetFeature(cmGeneratorTarget *this,string *feature,string *config)

{
  bool bVar1;
  ulong uVar2;
  string local_70;
  char local_49;
  undefined1 local_48 [8];
  string featureConfig;
  string *config_local;
  string *feature_local;
  cmGeneratorTarget *this_local;
  cmValue value;
  
  featureConfig.field_2._8_8_ = config;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_49 = '_';
    cmsys::SystemTools::UpperCase(&local_70,(string *)featureConfig.field_2._8_8_);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              ((string *)local_48,feature,&local_49,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_local = (cmGeneratorTarget *)GetProperty(this,(string *)local_48);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) {
      return (cmValue)(string *)this_local;
    }
  }
  this_local = (cmGeneratorTarget *)GetProperty(this,feature);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (!bVar1) {
    this_local = (cmGeneratorTarget *)
                 cmLocalGenerator::GetFeature
                           (this->LocalGenerator,feature,(string *)featureConfig.field_2._8_8_);
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmGeneratorTarget::GetFeature(const std::string& feature,
                                      const std::string& config) const
{
  if (!config.empty()) {
    std::string featureConfig =
      cmStrCat(feature, '_', cmSystemTools::UpperCase(config));
    if (cmValue value = this->GetProperty(featureConfig)) {
      return value;
    }
  }
  if (cmValue value = this->GetProperty(feature)) {
    return value;
  }
  return this->LocalGenerator->GetFeature(feature, config);
}